

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O2

void p_crypto_hash_sha2_512_update(PHashSHA2_512 *ctx,puchar *data,psize len)

{
  ulong uVar1;
  uint uVar2;
  ulong __n;
  uint uVar3;
  
  uVar1 = ctx->len_low;
  uVar2 = (uint)uVar1 & 0x7f;
  ctx->len_low = uVar1 + len;
  if (CARRY8(uVar1,len)) {
    ctx->len_high = ctx->len_high + 1;
  }
  uVar3 = 0;
  if ((uVar1 & 0x7f) != 0) {
    __n = (ulong)(0x80 - uVar2);
    uVar3 = uVar2;
    if (__n <= len) {
      memcpy((void *)((long)ctx->hash + ((ulong)((uint)uVar1 & 0x7f) - 0x80)),data,__n);
      pp_crypto_hash_sha2_512_swap_bytes((puint64 *)ctx,0x10);
      pp_crypto_hash_sha2_512_process(ctx,(puint64 *)ctx);
      data = data + __n;
      len = len - __n;
      uVar3 = 0;
    }
  }
  for (; 0x7f < len; len = len - 0x80) {
    memcpy(ctx,data,0x80);
    pp_crypto_hash_sha2_512_swap_bytes((puint64 *)ctx,0x10);
    pp_crypto_hash_sha2_512_process(ctx,(puint64 *)ctx);
    data = data + 0x80;
  }
  if (len == 0) {
    return;
  }
  memcpy((void *)((long)ctx->hash + ((ulong)uVar3 - 0x80)),data,len);
  return;
}

Assistant:

void
p_crypto_hash_sha2_512_update (PHashSHA2_512	*ctx,
			       const puchar	*data,
			       psize		len)
{
	puint32	left;
	puint32	to_fill;

	left = (puint32) (ctx->len_low & 0x7F);
	to_fill = 128 - left;

	ctx->len_low += (puint64) len;

	if (ctx->len_low < (puint64) len)
		++ctx->len_high;

	if (left && (puint64) len >= to_fill) {
		memcpy (ctx->buf.buf + left, data, to_fill);
		pp_crypto_hash_sha2_512_swap_bytes (ctx->buf.buf_w, 16);
		pp_crypto_hash_sha2_512_process (ctx, ctx->buf.buf_w);

		data += to_fill;
		len -= to_fill;
		left = 0;
	}

	while (len >= 128) {
		memcpy (ctx->buf.buf, data, 128);
		pp_crypto_hash_sha2_512_swap_bytes (ctx->buf.buf_w, 16);
		pp_crypto_hash_sha2_512_process (ctx, ctx->buf.buf_w);

		data += 128;
		len -= 128;
	}

	if (len > 0)
		memcpy (ctx->buf.buf + left, data, len);
}